

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_resources(Compiler *compiler,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources
                    )

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  FILE *pFVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  StorageClass SVar10;
  StorageClass SVar11;
  uint32_t uVar12;
  Bitset *pBVar13;
  SPIRType *pSVar14;
  size_t sVar15;
  size_t sVar16;
  long *plVar17;
  string *psVar18;
  uint uVar19;
  long *plVar20;
  byte bVar21;
  Resource *pRVar22;
  char cVar23;
  _Alloc_hider in_R8;
  uint *puVar24;
  ulong local_160;
  char *local_148;
  uint local_140;
  char local_138 [16];
  size_t local_128;
  SPIRType *local_120;
  Bitset mask;
  uint32_t counter_id;
  long local_d0;
  long local_c8;
  long lStack_c0;
  Resource *local_b8;
  string array;
  string local_70;
  string local_50;
  
  fprintf(_stderr,"%s\n",tag);
  fwrite("=============\n\n",0xf,1,_stderr);
  iVar9 = strcmp(tag,"ssbos");
  sVar15 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (sVar15 != 0) {
    pRVar22 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
    local_b8 = pRVar22 + sVar15;
    do {
      local_120 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar22->type_id).id);
      if ((iVar9 != 0) ||
         (bVar7 = spirv_cross::Compiler::buffer_is_hlsl_counter_buffer
                            (compiler,(VariableID)(pRVar22->id).id), !bVar7)) {
        SVar10 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar22->id).id);
        pSVar14 = local_120;
        pBVar13 = spirv_cross::Compiler::get_decoration_bitset
                            (compiler,(ID)(local_120->super_IVariant).self.id);
        bVar21 = 1;
        if ((pBVar13->lower & 4) == 0) {
          pBVar13 = spirv_cross::Compiler::get_decoration_bitset
                              (compiler,(ID)(pSVar14->super_IVariant).self.id);
          bVar21 = ((byte)pBVar13->lower & 8) >> 3;
        }
        local_160 = 0;
        bVar7 = false;
        if (bVar21 != 0) {
          SVar11 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar22->id).id);
          bVar7 = true;
          if (SVar11 != StorageClassUniform) {
            SVar11 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar22->id).id)
            ;
            bVar7 = SVar11 == StorageClassUniformConstant;
          }
        }
        uVar2 = (&pRVar22->id)[(ulong)(SVar10 != StorageClassPushConstant & bVar21) * 2].id;
        local_128 = 0;
        if (bVar7) {
          pSVar14 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar22->base_type_id).id);
          local_128 = spirv_cross::Compiler::get_declared_struct_size(compiler,pSVar14);
          sVar15 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,pSVar14,1)
          ;
          sVar16 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,pSVar14,0)
          ;
          local_160 = (ulong)(uint)((int)sVar15 - (int)sVar16);
        }
        mask.lower = 0;
        mask.higher._M_h._M_buckets = &mask.higher._M_h._M_single_bucket;
        mask.higher._M_h._M_bucket_count = 1;
        mask.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        mask.higher._M_h._M_element_count = 0;
        mask.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        mask.higher._M_h._M_rehash_policy._M_next_resize = 0;
        mask.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
        if (iVar9 == 0) {
          spirv_cross::Compiler::get_buffer_block_flags
                    ((Bitset *)&array,compiler,(VariableID)(pRVar22->id).id);
          mask.lower = (uint64_t)array._M_dataplus._M_p;
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_move_assign(&mask.higher._M_h,&array._M_string_length);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&array._M_string_length);
        }
        else {
          pBVar13 = spirv_cross::Compiler::get_decoration_bitset(compiler,(ID)(pRVar22->id).id);
          mask.lower = pBVar13->lower;
          if (pBVar13 != &mask) {
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&mask.higher,&(pBVar13->higher)._M_h);
          }
        }
        array._M_dataplus._M_p = (pointer)&array.field_2;
        array._M_string_length = 0;
        array.field_2._M_local_buf[0] = '\0';
        sVar15 = (local_120->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar15 != 0) {
          puVar24 = (local_120->array).super_VectorView<unsigned_int>.ptr;
          puVar1 = puVar24 + sVar15;
          do {
            uVar3 = *puVar24;
            if (uVar3 == 0) {
              local_148 = local_138;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
            }
            else {
              cVar23 = '\x01';
              if (9 < uVar3) {
                uVar19 = uVar3;
                cVar6 = '\x04';
                do {
                  cVar23 = cVar6;
                  if (uVar19 < 100) {
                    cVar23 = cVar23 + -2;
                    goto LAB_0010ba51;
                  }
                  if (uVar19 < 1000) {
                    cVar23 = cVar23 + -1;
                    goto LAB_0010ba51;
                  }
                  if (uVar19 < 10000) goto LAB_0010ba51;
                  bVar8 = 99999 < uVar19;
                  uVar19 = uVar19 / 10000;
                  cVar6 = cVar23 + '\x04';
                } while (bVar8);
                cVar23 = cVar23 + '\x01';
              }
LAB_0010ba51:
              local_148 = local_138;
              std::__cxx11::string::_M_construct((ulong)&local_148,cVar23);
              std::__detail::__to_chars_10_impl<unsigned_int>(local_148,local_140,uVar3);
            }
            spirv_cross::join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&local_70,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c191f
                       ,(char (*) [2])in_R8._M_p);
            plVar17 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_70,(ulong)array._M_dataplus._M_p);
            plVar20 = plVar17 + 2;
            if ((long *)*plVar17 == plVar20) {
              local_c8 = *plVar20;
              lStack_c0 = plVar17[3];
              _counter_id = &local_c8;
            }
            else {
              local_c8 = *plVar20;
              _counter_id = (long *)*plVar17;
            }
            local_d0 = plVar17[1];
            *plVar17 = (long)plVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::operator=((string *)&array,(string *)&counter_id);
            if (_counter_id != &local_c8) {
              operator_delete(_counter_id);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (local_148 != local_138) {
              operator_delete(local_148);
            }
            puVar24 = puVar24 + 1;
          } while (puVar24 != puVar1);
        }
        pFVar5 = _stderr;
        uVar3 = (pRVar22->id).id;
        sVar4 = (pRVar22->name)._M_string_length;
        if (sVar4 == 0) {
          (*compiler->_vptr_Compiler[3])(&local_50,compiler,(ulong)uVar2);
          psVar18 = &local_50;
        }
        else {
          psVar18 = &pRVar22->name;
        }
        in_R8._M_p = array._M_dataplus._M_p;
        fprintf(pFVar5," ID %03u : %s%s",(ulong)uVar3,(psVar18->_M_dataplus)._M_p);
        if ((sVar4 == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pFVar5 = _stderr;
        if ((mask.lower & 0x40000000) != 0) {
          uVar12 = spirv_cross::Compiler::get_decoration
                             (compiler,(ID)(pRVar22->id).id,DecorationLocation);
          fprintf(pFVar5," (Location : %u)",(ulong)uVar12);
        }
        pFVar5 = _stderr;
        if ((mask.lower & 0x400000000) != 0) {
          uVar12 = spirv_cross::Compiler::get_decoration
                             (compiler,(ID)(pRVar22->id).id,DecorationDescriptorSet);
          fprintf(pFVar5," (Set : %u)",(ulong)uVar12);
        }
        pFVar5 = _stderr;
        if ((mask.lower & 0x200000000) != 0) {
          uVar12 = spirv_cross::Compiler::get_decoration
                             (compiler,(ID)(pRVar22->id).id,DecorationBinding);
          fprintf(pFVar5," (Binding : %u)",(ulong)uVar12);
        }
        bVar8 = spirv_cross::CompilerGLSL::variable_is_depth_or_compare
                          ((CompilerGLSL *)compiler,(VariableID)(pRVar22->id).id);
        if (bVar8) {
          fwrite(" (comparison)",0xd,1,_stderr);
        }
        pFVar5 = _stderr;
        if ((mask.lower & 0x80000000000) != 0) {
          uVar12 = spirv_cross::Compiler::get_decoration
                             (compiler,(ID)(pRVar22->id).id,DecorationInputAttachmentIndex);
          fprintf(pFVar5," (Attachment : %u)",(ulong)uVar12);
        }
        if ((mask.lower & 0x2000000) != 0) {
          fwrite(" writeonly",10,1,_stderr);
        }
        if ((mask.lower & 0x1000000) != 0) {
          fwrite(" readonly",9,1,_stderr);
        }
        if ((mask.lower & 0x80000) != 0) {
          fwrite(" restrict",9,1,_stderr);
        }
        if ((mask.lower & 0x800000) != 0) {
          fwrite(" coherent",9,1,_stderr);
        }
        if ((mask.lower & 0x200000) != 0) {
          fwrite(" volatile",9,1,_stderr);
        }
        if (bVar7) {
          fprintf(_stderr," (BlockSize : %u bytes)",local_128);
          if ((int)local_160 != 0) {
            fprintf(_stderr," (Unsized array stride: %u bytes)",local_160);
          }
        }
        _counter_id = (long *)((ulong)_counter_id & 0xffffffff00000000);
        if ((iVar9 == 0) &&
           (bVar7 = spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
                              (compiler,(VariableID)(pRVar22->id).id,&counter_id), bVar7)) {
          fprintf(_stderr," (HLSL counter buffer ID: %u)",(ulong)_counter_id & 0xffffffff);
        }
        fputc(10,_stderr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)array._M_dataplus._M_p != &array.field_2) {
          operator_delete(array._M_dataplus._M_p);
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&mask.higher._M_h);
      }
      pRVar22 = pRVar22 + 1;
    } while (pRVar22 != local_b8);
  }
  fwrite("=============\n\n",0xf,1,_stderr);
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, const char *tag, const SmallVector<Resource> &resources)
{
	fprintf(stderr, "%s\n", tag);
	fprintf(stderr, "=============\n\n");
	bool print_ssbo = !strcmp(tag, "ssbos");

	for (auto &res : resources)
	{
		auto &type = compiler.get_type(res.type_id);

		if (print_ssbo && compiler.buffer_is_hlsl_counter_buffer(res.id))
			continue;

		// If we don't have a name, use the fallback for the type instead of the variable
		// for SSBOs and UBOs since those are the only meaningful names to use externally.
		// Push constant blocks are still accessed by name and not block name, even though they are technically Blocks.
		bool is_push_constant = compiler.get_storage_class(res.id) == StorageClassPushConstant;
		bool is_block = compiler.get_decoration_bitset(type.self).get(DecorationBlock) ||
		                compiler.get_decoration_bitset(type.self).get(DecorationBufferBlock);
		bool is_sized_block = is_block && (compiler.get_storage_class(res.id) == StorageClassUniform ||
		                                   compiler.get_storage_class(res.id) == StorageClassUniformConstant);
		ID fallback_id = !is_push_constant && is_block ? ID(res.base_type_id) : ID(res.id);

		uint32_t block_size = 0;
		uint32_t runtime_array_stride = 0;
		if (is_sized_block)
		{
			auto &base_type = compiler.get_type(res.base_type_id);
			block_size = uint32_t(compiler.get_declared_struct_size(base_type));
			runtime_array_stride = uint32_t(compiler.get_declared_struct_size_runtime_array(base_type, 1) -
			                                compiler.get_declared_struct_size_runtime_array(base_type, 0));
		}

		Bitset mask;
		if (print_ssbo)
			mask = compiler.get_buffer_block_flags(res.id);
		else
			mask = compiler.get_decoration_bitset(res.id);

		string array;
		for (auto arr : type.array)
			array = join("[", arr ? convert_to_string(arr) : "", "]") + array;

		fprintf(stderr, " ID %03u : %s%s", uint32_t(res.id),
		        !res.name.empty() ? res.name.c_str() : compiler.get_fallback_name(fallback_id).c_str(), array.c_str());

		if (mask.get(DecorationLocation))
			fprintf(stderr, " (Location : %u)", compiler.get_decoration(res.id, DecorationLocation));
		if (mask.get(DecorationDescriptorSet))
			fprintf(stderr, " (Set : %u)", compiler.get_decoration(res.id, DecorationDescriptorSet));
		if (mask.get(DecorationBinding))
			fprintf(stderr, " (Binding : %u)", compiler.get_decoration(res.id, DecorationBinding));
		if (static_cast<const CompilerGLSL &>(compiler).variable_is_depth_or_compare(res.id))
			fprintf(stderr, " (comparison)");
		if (mask.get(DecorationInputAttachmentIndex))
			fprintf(stderr, " (Attachment : %u)", compiler.get_decoration(res.id, DecorationInputAttachmentIndex));
		if (mask.get(DecorationNonReadable))
			fprintf(stderr, " writeonly");
		if (mask.get(DecorationNonWritable))
			fprintf(stderr, " readonly");
		if (mask.get(DecorationRestrict))
			fprintf(stderr, " restrict");
		if (mask.get(DecorationCoherent))
			fprintf(stderr, " coherent");
		if (mask.get(DecorationVolatile))
			fprintf(stderr, " volatile");
		if (is_sized_block)
		{
			fprintf(stderr, " (BlockSize : %u bytes)", block_size);
			if (runtime_array_stride)
				fprintf(stderr, " (Unsized array stride: %u bytes)", runtime_array_stride);
		}

		uint32_t counter_id = 0;
		if (print_ssbo && compiler.buffer_get_hlsl_counter_buffer(res.id, counter_id))
			fprintf(stderr, " (HLSL counter buffer ID: %u)", counter_id);
		fprintf(stderr, "\n");
	}
	fprintf(stderr, "=============\n\n");
}